

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

int DIST_POINT_set_dpname(DIST_POINT_NAME *dpn,X509_NAME *iname)

{
  stack_st_X509_NAME_ENTRY *sk;
  int iVar1;
  X509_NAME *pXVar2;
  stack_st_X509_NAME_ENTRY *psVar3;
  X509_NAME_ENTRY *ne_00;
  X509_NAME_ENTRY *ne;
  stack_st_X509_NAME_ENTRY *frag;
  size_t i;
  X509_NAME *iname_local;
  DIST_POINT_NAME *dpn_local;
  
  if ((dpn == (DIST_POINT_NAME *)0x0) || (dpn->type != 1)) {
    dpn_local._4_4_ = 1;
  }
  else {
    sk = (stack_st_X509_NAME_ENTRY *)(dpn->name).fullname;
    pXVar2 = X509_NAME_dup(iname);
    dpn->dpname = pXVar2;
    if (dpn->dpname == (X509_NAME *)0x0) {
      dpn_local._4_4_ = 0;
    }
    else {
      for (frag = (stack_st_X509_NAME_ENTRY *)0x0;
          psVar3 = (stack_st_X509_NAME_ENTRY *)sk_X509_NAME_ENTRY_num(sk), frag < psVar3;
          frag = frag + 1) {
        ne_00 = (X509_NAME_ENTRY *)sk_X509_NAME_ENTRY_value(sk,(size_t)frag);
        iVar1 = X509_NAME_add_entry(dpn->dpname,ne_00,-1,
                                    (uint)(frag == (stack_st_X509_NAME_ENTRY *)0x0));
        if (iVar1 == 0) {
          X509_NAME_free(dpn->dpname);
          dpn->dpname = (X509_NAME *)0x0;
          return 0;
        }
      }
      iVar1 = i2d_X509_NAME(dpn->dpname,(uchar **)0x0);
      if (iVar1 < 0) {
        X509_NAME_free(dpn->dpname);
        dpn->dpname = (X509_NAME *)0x0;
        dpn_local._4_4_ = 0;
      }
      else {
        dpn_local._4_4_ = 1;
      }
    }
  }
  return dpn_local._4_4_;
}

Assistant:

int DIST_POINT_set_dpname(DIST_POINT_NAME *dpn, X509_NAME *iname) {
  size_t i;
  STACK_OF(X509_NAME_ENTRY) *frag;
  X509_NAME_ENTRY *ne;
  if (!dpn || (dpn->type != 1)) {
    return 1;
  }
  frag = dpn->name.relativename;
  dpn->dpname = X509_NAME_dup(iname);
  if (!dpn->dpname) {
    return 0;
  }
  for (i = 0; i < sk_X509_NAME_ENTRY_num(frag); i++) {
    ne = sk_X509_NAME_ENTRY_value(frag, i);
    if (!X509_NAME_add_entry(dpn->dpname, ne, -1, i ? 0 : 1)) {
      X509_NAME_free(dpn->dpname);
      dpn->dpname = NULL;
      return 0;
    }
  }
  // generate cached encoding of name
  if (i2d_X509_NAME(dpn->dpname, NULL) < 0) {
    X509_NAME_free(dpn->dpname);
    dpn->dpname = NULL;
    return 0;
  }
  return 1;
}